

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

string * __thiscall
t_javame_generator::base_type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_javame_generator *this,t_base_type *type,
          bool in_container)

{
  uint uVar1;
  char *pcVar2;
  undefined1 auVar3 [12];
  char *local_118;
  char *local_100;
  char *local_d8;
  char *local_c0;
  char *local_a8;
  string local_68;
  allocator local_44;
  allocator local_43;
  allocator local_42;
  allocator local_41;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d [20];
  allocator local_29;
  t_base local_28;
  byte local_21;
  t_base tbase;
  bool in_container_local;
  t_base_type *type_local;
  t_javame_generator *this_local;
  
  local_21 = in_container;
  _tbase = type;
  type_local = (t_base_type *)this;
  this_local = (t_javame_generator *)__return_storage_ptr__;
  local_28 = t_base_type::get_base(type);
  switch(local_28) {
  case TYPE_VOID:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"void",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case TYPE_STRING:
    uVar1 = (*(_tbase->super_t_type).super_t_doc._vptr_t_doc[7])();
    if ((uVar1 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"String",local_3d);
      std::allocator<char>::~allocator((allocator<char> *)local_3d);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"byte[]",&local_3e);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e);
    }
    break;
  case TYPE_BOOL:
    if ((local_21 & 1) == 0) {
      local_a8 = "boolean";
    }
    else {
      local_a8 = "Boolean";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_a8,&local_3f);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f);
    break;
  case TYPE_I8:
    if ((local_21 & 1) == 0) {
      local_c0 = "TType byte";
    }
    else {
      local_c0 = "TType.Byte";
    }
    local_c0 = local_c0 + 6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_c0,&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_40);
    break;
  case TYPE_I16:
    if ((local_21 & 1) == 0) {
      local_d8 = "short";
    }
    else {
      local_d8 = "Short";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_d8,&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    break;
  case TYPE_I32:
    pcVar2 = "int";
    if ((local_21 & 1) != 0) {
      pcVar2 = "Integer";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_42);
    std::allocator<char>::~allocator((allocator<char> *)&local_42);
    break;
  case TYPE_I64:
    if ((local_21 & 1) == 0) {
      local_100 = "long";
    }
    else {
      local_100 = "Long";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_100,&local_43);
    std::allocator<char>::~allocator((allocator<char> *)&local_43);
    break;
  case TYPE_DOUBLE:
    if ((local_21 & 1) == 0) {
      local_118 = "TType double";
    }
    else {
      local_118 = "TType.Double";
    }
    local_118 = local_118 + 6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_118,&local_44);
    std::allocator<char>::~allocator((allocator<char> *)&local_44);
    break;
  default:
    auVar3 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&local_68,(t_base_type *)(ulong)local_28,auVar3._8_4_);
    std::operator+(auVar3._0_8_,"compiler error: no Java name for base type ",&local_68);
    __cxa_throw(auVar3._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_javame_generator::base_type_name(t_base_type* type, bool in_container) {
  t_base_type::t_base tbase = type->get_base();

  switch (tbase) {
  case t_base_type::TYPE_VOID:
    return "void";
  case t_base_type::TYPE_STRING:
    if (!type->is_binary()) {
      return "String";
    } else {
      return "byte[]";
    }
  case t_base_type::TYPE_BOOL:
    return (in_container ? "Boolean" : "boolean");
  case t_base_type::TYPE_I8:
    return (in_container ? "Byte" : "byte");
  case t_base_type::TYPE_I16:
    return (in_container ? "Short" : "short");
  case t_base_type::TYPE_I32:
    return (in_container ? "Integer" : "int");
  case t_base_type::TYPE_I64:
    return (in_container ? "Long" : "long");
  case t_base_type::TYPE_DOUBLE:
    return (in_container ? "Double" : "double");
  default:
    throw "compiler error: no Java name for base type " + t_base_type::t_base_name(tbase);
  }
}